

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

int __thiscall pybind11::detail::enum_base::init(enum_base *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  internals *piVar1;
  char in_DL;
  handle property;
  handle static_property;
  cpp_function local_90;
  is_method local_88;
  is_method local_80;
  type local_71;
  accessor<pybind11::detail::accessor_policies::str_attr> local_70;
  object local_50;
  cpp_function local_48;
  char local_3c;
  cpp_function local_38;
  
  dict::dict((dict *)&local_48);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__entries";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(dict *)&local_48);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_48);
  local_48.super_function.super_object.super_handle.m_ptr = (function)&PyProperty_Type;
  piVar1 = get_internals();
  local_38.super_function.super_object.super_handle.m_ptr = (function)piVar1->static_property_type;
  local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_1_,pybind11::is_method,void>
            (&local_90,(type *)&local_80,&local_88);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__repr__";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
  local_80.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_2_,pybind11::is_method,void>
            ((cpp_function *)&local_88,(type *)&local_50,&local_80);
  object_api<pybind11::handle>::operator()((object_api<pybind11::handle> *)&local_90,&local_48);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "name";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(object *)&local_90);
  local_3c = in_DL;
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object((object *)&local_88);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_3_,,void>
            ((cpp_function *)&local_88,&local_71);
  __Py_NoneStruct = __Py_NoneStruct + 2;
  local_80.class_.m_ptr = (handle)&_Py_NoneStruct;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_90,&local_38,(none *)&local_88,(none *)&local_80
             ,(char (*) [1])&local_50);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__doc__";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(object *)&local_90);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object(&local_50);
  pybind11::object::~object((object *)&local_80);
  pybind11::object::~object((object *)&local_88);
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::handle)_4_,,void>
            ((cpp_function *)&local_88,(type *)&local_71);
  local_80.class_.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 2;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  object_api<pybind11::handle>::operator()
            ((object_api<pybind11::handle> *)&local_90,&local_38,(none *)&local_88,(none *)&local_80
             ,(char (*) [1])&local_50);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__members__";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(object *)&local_90);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
  pybind11::object::~object(&local_50);
  pybind11::object::~object((object *)&local_80);
  pybind11::object::~object((object *)&local_88);
  if (local_3c == '\0') {
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_13_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__eq__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_14_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__ne__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    if ((char)ctx == '\0') goto LAB_001cc03f;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_15_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__lt__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_16_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__gt__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_17_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__le__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_18_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__ge__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
  }
  else {
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_1_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__eq__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_2_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__ne__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    if ((char)ctx == '\0') goto LAB_001cc03f;
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_3_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__lt__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_4_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__gt__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_5_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__le__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_6_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__ge__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_7_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__and__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_8_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__rand__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_9_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__or__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_10_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__ror__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_11_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__xor__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object,pybind11::object)_12_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__rxor__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
    pybind11::object::~object((object *)&local_70.cache.super_handle);
    pybind11::object::~object((object *)&local_90);
    local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
    cpp_function::
    cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_1_,pybind11::is_method,void>
              (&local_90,(type *)&local_80,&local_88);
    local_70.obj.m_ptr = (this->m_base).m_ptr;
    local_70.key = "__invert__";
    local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,&local_90);
  }
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
LAB_001cc03f:
  local_88.class_.m_ptr = (handle)(this->m_base).m_ptr;
  cpp_function::
  cpp_function<pybind11::detail::enum_base::init(bool,bool)::_lambda(pybind11::object)_2_,pybind11::is_method,void>
            ((cpp_function *)&local_70,(type *)&local_80,&local_88);
  local_90.super_function.super_object.super_handle.m_ptr = (function)(function)local_70._0_8_;
  local_70._0_8_ = (PyObject *)0x0;
  pybind11::object::~object((object *)&local_70);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__getstate__";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(object *)&local_90);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  local_70.obj.m_ptr = (this->m_base).m_ptr;
  local_70.key = "__hash__";
  local_70.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_70,(object *)&local_90);
  pybind11::object::~object((object *)&local_70.cache.super_handle);
  pybind11::object::~object((object *)&local_90);
  return extraout_EAX;
}

Assistant:

PYBIND11_NOINLINE void init(bool is_arithmetic, bool is_convertible) {
        m_base.attr("__entries") = dict();
        auto property = handle((PyObject *) &PyProperty_Type);
        auto static_property = handle((PyObject *) get_internals().static_property_type);

        m_base.attr("__repr__") = cpp_function(
            [](handle arg) -> str {
                handle type = arg.get_type();
                object type_name = type.attr("__name__");
                dict entries = type.attr("__entries");
                for (const auto &kv : entries) {
                    object other = kv.second[int_(0)];
                    if (other.equal(arg))
                        return pybind11::str("{}.{}").format(type_name, kv.first);
                }
                return pybind11::str("{}.???").format(type_name);
            }, is_method(m_base)
        );

        m_base.attr("name") = property(cpp_function(
            [](handle arg) -> str {
                dict entries = arg.get_type().attr("__entries");
                for (const auto &kv : entries) {
                    if (handle(kv.second[int_(0)]).equal(arg))
                        return pybind11::str(kv.first);
                }
                return "???";
            }, is_method(m_base)
        ));

        m_base.attr("__doc__") = static_property(cpp_function(
            [](handle arg) -> std::string {
                std::string docstring;
                dict entries = arg.attr("__entries");
                if (((PyTypeObject *) arg.ptr())->tp_doc)
                    docstring += std::string(((PyTypeObject *) arg.ptr())->tp_doc) + "\n\n";
                docstring += "Members:";
                for (const auto &kv : entries) {
                    auto key = std::string(pybind11::str(kv.first));
                    auto comment = kv.second[int_(1)];
                    docstring += "\n\n  " + key;
                    if (!comment.is_none())
                        docstring += " : " + (std::string) pybind11::str(comment);
                }
                return docstring;
            }
        ), none(), none(), "");

        m_base.attr("__members__") = static_property(cpp_function(
            [](handle arg) -> dict {
                dict entries = arg.attr("__entries"), m;
                for (const auto &kv : entries)
                    m[kv.first] = kv.second[int_(0)];
                return m;
            }), none(), none(), ""
        );

        #define PYBIND11_ENUM_OP_STRICT(op, expr, strict_behavior)                     \
            m_base.attr(op) = cpp_function(                                            \
                [](object a, object b) {                                               \
                    if (!a.get_type().is(b.get_type()))                                \
                        strict_behavior;                                               \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV(op, expr)                                        \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b_) {                                             \
                    int_ a(a_), b(b_);                                                 \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        #define PYBIND11_ENUM_OP_CONV_LHS(op, expr)                                    \
            m_base.attr(op) = cpp_function(                                            \
                [](object a_, object b) {                                              \
                    int_ a(a_);                                                        \
                    return expr;                                                       \
                },                                                                     \
                is_method(m_base))

        if (is_convertible) {
            PYBIND11_ENUM_OP_CONV_LHS("__eq__", !b.is_none() &&  a.equal(b));
            PYBIND11_ENUM_OP_CONV_LHS("__ne__",  b.is_none() || !a.equal(b));

            if (is_arithmetic) {
                PYBIND11_ENUM_OP_CONV("__lt__",   a <  b);
                PYBIND11_ENUM_OP_CONV("__gt__",   a >  b);
                PYBIND11_ENUM_OP_CONV("__le__",   a <= b);
                PYBIND11_ENUM_OP_CONV("__ge__",   a >= b);
                PYBIND11_ENUM_OP_CONV("__and__",  a &  b);
                PYBIND11_ENUM_OP_CONV("__rand__", a &  b);
                PYBIND11_ENUM_OP_CONV("__or__",   a |  b);
                PYBIND11_ENUM_OP_CONV("__ror__",  a |  b);
                PYBIND11_ENUM_OP_CONV("__xor__",  a ^  b);
                PYBIND11_ENUM_OP_CONV("__rxor__", a ^  b);
                m_base.attr("__invert__") = cpp_function(
                    [](object arg) { return ~(int_(arg)); }, is_method(m_base));
            }
        } else {
            PYBIND11_ENUM_OP_STRICT("__eq__",  int_(a).equal(int_(b)), return false);
            PYBIND11_ENUM_OP_STRICT("__ne__", !int_(a).equal(int_(b)), return true);

            if (is_arithmetic) {
                #define PYBIND11_THROW throw type_error("Expected an enumeration of matching type!");
                PYBIND11_ENUM_OP_STRICT("__lt__", int_(a) <  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__gt__", int_(a) >  int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__le__", int_(a) <= int_(b), PYBIND11_THROW);
                PYBIND11_ENUM_OP_STRICT("__ge__", int_(a) >= int_(b), PYBIND11_THROW);
                #undef PYBIND11_THROW
            }
        }

        #undef PYBIND11_ENUM_OP_CONV_LHS
        #undef PYBIND11_ENUM_OP_CONV
        #undef PYBIND11_ENUM_OP_STRICT

        object getstate = cpp_function(
            [](object arg) { return int_(arg); }, is_method(m_base));

        m_base.attr("__getstate__") = getstate;
        m_base.attr("__hash__") = getstate;
    }